

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmScanDepFormat.cxx
# Opt level: O1

bool ParseFilename(Value *val,string *result)

{
  bool bVar1;
  String local_40;
  
  bVar1 = Json::Value::isString(val);
  if (bVar1) {
    Json::Value::asString_abi_cxx11_(&local_40,val);
    std::__cxx11::string::operator=((string *)result,(string *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar1;
}

Assistant:

static bool ParseFilename(Json::Value const& val, std::string& result)
{
  if (val.isString()) {
    result = val.asString();
  } else {
    return false;
  }

  return true;
}